

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSBuilder::ensureModuleVar(Wasm2JSBuilder *this,Ref ast,Importable *imp)

{
  ValueBuilder *this_00;
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  Ref r;
  Ref RVar4;
  Ref RVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  Ref in_R8;
  IString IVar6;
  Name name;
  IString name_00;
  IString str;
  IString name_01;
  IString name_02;
  
  sVar3 = std::
          _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&(this->seenModuleImports)._M_h,&(imp->module).super_IString);
  if (sVar3 != 0) {
    return;
  }
  r = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,r);
  name.super_IString.str._M_str = extraout_RDX;
  name.super_IString.str._M_len = (size_t)(imp->module).super_IString.str._M_str;
  bVar2 = needsQuoting((wasm *)(imp->module).super_IString.str._M_len,name);
  name_00.str._M_str = extraout_RDX_00;
  name_00.str._M_len = DAT_01176570;
  RVar4 = cashew::ValueBuilder::makeName(importObject,name_00);
  this_00 = (ValueBuilder *)(imp->module).super_IString.str._M_len;
  pcVar1 = (imp->module).super_IString.str._M_str;
  if (bVar2) {
    str.str._M_str = extraout_RDX_01;
    str.str._M_len = (size_t)pcVar1;
    RVar5 = cashew::ValueBuilder::makeString(this_00,str);
    RVar4 = cashew::ValueBuilder::makeSub(RVar4,RVar5);
  }
  else {
    name_01.str._M_str = extraout_RDX_01;
    name_01.str._M_len = (size_t)pcVar1;
    RVar5 = cashew::ValueBuilder::makeName(this_00,name_01);
    RVar4 = cashew::ValueBuilder::makeDot(RVar4,RVar5);
  }
  IVar6 = fromName(this,(imp->module).super_IString.str,Top);
  name_02.str._M_len = IVar6.str._M_str;
  name_02.str._M_str = (char *)RVar4.inst;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)r.inst,(Value *)IVar6.str._M_len,name_02,in_R8);
  std::__detail::
  _Insert_base<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&this->seenModuleImports,&(imp->module).super_IString);
  return;
}

Assistant:

void Wasm2JSBuilder::ensureModuleVar(Ref ast, const Importable& imp) {
  if (seenModuleImports.count(imp.module) > 0) {
    return;
  }
  Ref theVar = ValueBuilder::makeVar();
  ast->push_back(theVar);
  Ref rhs;
  if (needsQuoting(imp.module)) {
    rhs = ValueBuilder::makeSub(ValueBuilder::makeName(importObject),
                                ValueBuilder::makeString(imp.module));
  } else {
    rhs = ValueBuilder::makeDot(ValueBuilder::makeName(importObject),
                                ValueBuilder::makeName(imp.module));
  }

  ValueBuilder::appendToVar(theVar, fromName(imp.module, NameScope::Top), rhs);
  seenModuleImports.insert(imp.module);
}